

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::Cord::AppendImpl<absl::Cord_const&>(Cord *this,Cord *src)

{
  bool bVar1;
  size_t sVar2;
  CordRepFlat *pCVar3;
  CordRep *pCVar4;
  uint8_t *puVar5;
  reference src_00;
  string_view src_01;
  ChunkIterator __begin0;
  
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  bVar1 = empty(src);
  if (!bVar1) {
    bVar1 = empty(this);
    if (!bVar1) {
      sVar2 = InlineRep::size(&src->contents_);
      if (0x1ff < sVar2) {
        pCVar4 = TakeRep(src);
        pCVar4 = cord_internal::RemoveCrcNode(pCVar4);
        InlineRep::AppendTree(&this->contents_,pCVar4,kAppendCord);
        return;
      }
      pCVar4 = InlineRep::tree(&src->contents_);
      if (pCVar4 == (CordRep *)0x0) {
        puVar5 = (uint8_t *)InlineRep::data(&src->contents_);
      }
      else {
        if (pCVar4->tag < 6) {
          if (src != this) {
            ChunkIterator::ChunkIterator(&__begin0,src);
            while (__begin0.bytes_remaining_ != 0) {
              src_00 = ChunkIterator::operator*(&__begin0);
              Append(this,src_00);
              ChunkIterator::operator++(&__begin0);
            }
            return;
          }
          InlineRep::InlineRep((InlineRep *)&__begin0,&src->contents_);
          AppendImpl<absl::Cord>(this,(Cord *)&__begin0);
          ~Cord((Cord *)&__begin0);
          return;
        }
        pCVar3 = cord_internal::CordRep::flat(pCVar4);
        puVar5 = (pCVar3->super_CordRep).storage;
      }
      src_01._M_str = (char *)puVar5;
      src_01._M_len = sVar2;
      InlineRep::AppendArray(&this->contents_,src_01,kAppendCord);
      return;
    }
    if (((src->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
      pCVar4 = TakeRep(src);
      pCVar4 = cord_internal::RemoveCrcNode(pCVar4);
      InlineRep::EmplaceTree(&this->contents_,pCVar4,kAppendCord);
      return;
    }
    pCVar4 = (src->contents_).data_.rep_.field_0.as_tree.rep;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info =
         (src->contents_).data_.rep_.field_0.as_tree.cordz_info;
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar4;
  }
  return;
}

Assistant:

inline void Cord::AppendImpl(C&& src) {
  auto constexpr method = CordzUpdateTracker::kAppendCord;

  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  if (empty()) {
    // Since destination is empty, we can avoid allocating a node,
    if (src.contents_.is_tree()) {
      // by taking the tree directly
      CordRep* rep =
          cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
      contents_.EmplaceTree(rep, method);
    } else {
      // or copying over inline data
      contents_.data_ = src.contents_.data_;
    }
    return;
  }

  // For short cords, it is faster to copy data if there is room in dst.
  const size_t src_size = src.contents_.size();
  if (src_size <= kMaxBytesToCopy) {
    CordRep* src_tree = src.contents_.tree();
    if (src_tree == nullptr) {
      // src has embedded data.
      contents_.AppendArray({src.contents_.data(), src_size}, method);
      return;
    }
    if (src_tree->IsFlat()) {
      // src tree just has one flat node.
      contents_.AppendArray({src_tree->flat()->Data(), src_size}, method);
      return;
    }
    if (&src == this) {
      // ChunkIterator below assumes that src is not modified during traversal.
      Append(Cord(src));
      return;
    }
    // TODO(mec): Should we only do this if "dst" has space?
    for (absl::string_view chunk : src.Chunks()) {
      Append(chunk);
    }
    return;
  }

  // Guaranteed to be a tree (kMaxBytesToCopy > kInlinedSize)
  CordRep* rep = cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
  contents_.AppendTree(rep, CordzUpdateTracker::kAppendCord);
}